

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitroot.c
# Opt level: O2

void ur_pp2(double *x,int N,char *type,char *model,int lshort,int *klag,double *cval,double *cprobs,
           double *auxstat,int *laux,double *teststat)

{
  char *pcVar1;
  int iVar2;
  reg_object obj;
  ulong uVar3;
  void *__src;
  double *varcovar;
  void *__ptr;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  size_t sVar9;
  double *pdVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  char *pcVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double *local_e0;
  double *local_d8;
  double *local_c8;
  double *local_c0;
  double *local_98;
  double local_88;
  double sig;
  double local_78;
  char *local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double *local_38;
  
  local_40 = (double)CONCAT44(local_40._4_4_,N + -1);
  local_68 = (double)(N + -1);
  local_70 = type;
  local_38 = x;
  dVar11 = pow(local_68 / 100.0,0.25);
  local_60 = (double)(ulong)(uint)(int)(dVar11 * *(double *)
                                                  (&DAT_00150c78 + (ulong)(lshort == 1) * 8));
  if ((klag != (int *)0x0) && (0 < *klag)) {
    local_60 = (double)(ulong)(uint)*klag;
  }
  pdVar10 = local_38 + 1;
  iVar2 = strcmp(model,"trend");
  lVar7 = (long)local_40._0_4_;
  iVar8 = SUB84(local_60,0);
  lVar6 = (long)iVar8;
  if (iVar2 == 0) {
    dVar11 = (double)(local_40._0_4_ * local_40._0_4_);
    *cval = -47.44 / dVar11 + -8.353 / local_68 + -3.9638;
    cval[1] = -17.83 / dVar11 + -4.039 / local_68 + -3.4126;
    cval[2] = -7.58 / dVar11 + -2.418 / local_68 + -3.1279;
    *cprobs = 0.01;
    cprobs[1] = 0.05;
    cprobs[2] = 0.1;
    sVar9 = lVar7 * 8;
    __src = malloc(sVar9);
    local_58 = (double)sVar9;
    local_c0 = (double *)malloc(sVar9);
    for (lVar5 = 1; lVar5 < N; lVar5 = lVar5 + 1) {
      local_c0[lVar5 + -1] = (double)(int)lVar5;
      *(double *)((long)__src + lVar5 * 8 + -8) = (double)(int)lVar5 - local_68 * 0.5;
    }
    varcovar = (double *)malloc(0x48);
    local_48 = (double)lVar7;
    local_e0 = (double *)malloc(lVar7 << 4);
    dVar16 = local_58;
    local_c8 = (double *)malloc((size_t)local_58);
    memcpy(local_e0,local_38,(size_t)dVar16);
    memcpy(local_e0 + (long)local_48,__src,(size_t)dVar16);
    dVar18 = local_40;
    iVar2 = local_40._0_4_;
    obj = reg_init(local_40._0_4_,3);
    regress(obj,local_e0,pdVar10,local_c8,varcovar,0.95);
    sig = obj->beta[0].value;
    local_50 = obj->beta[0].stdErr;
    dVar16 = obj[1].sigma_upper;
    dVar12 = obj[1].R2[0];
    dVar20 = mean(pdVar10,iVar2);
    uVar3 = 0;
    uVar4 = 0;
    if (0 < iVar2) {
      uVar4 = (ulong)dVar18 & 0xffffffff;
    }
    local_38 = (double *)0x0;
    dVar18 = 0.0;
    dVar21 = 0.0;
    local_58 = 0.0;
    local_48 = 0.0;
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      local_38 = (double *)((double)local_38 + local_c8[uVar3] * local_c8[uVar3]);
      dVar13 = pdVar10[uVar3];
      dVar18 = dVar18 + (dVar13 - dVar20) * (dVar13 - dVar20);
      dVar21 = dVar21 + dVar13 * dVar13;
      local_48 = local_48 + dVar13;
      local_58 = local_58 + dVar13 * local_c0[uVar3];
    }
    sig = sig / local_50;
    local_50 = 1.0 / local_68;
    local_78 = 1.0 / dVar11;
    dVar18 = dVar18 * local_78;
    dVar20 = pow(local_68,-2.5);
    dVar13 = pow(local_68,-1.5);
    __ptr = malloc(lVar6 * 4);
    local_98 = (double *)malloc(lVar6 << 3);
    local_d8 = (double *)malloc(lVar6 << 3);
    uVar3 = 0;
    uVar4 = 0;
    if (0 < SUB84(local_60,0)) {
      uVar4 = (ulong)local_60 & 0xffffffff;
    }
    while (uVar4 != uVar3) {
      *(int *)((long)__ptr + uVar3 * 4) = (int)(uVar3 + 1);
      uVar3 = uVar3 + 1;
    }
    local_38 = (double *)((double)local_38 * local_50);
    local_58 = local_58 * dVar20;
    pdVar10 = local_98;
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      iVar2 = *(int *)((long)__ptr + uVar3 * 4);
      mmult(local_c8 + iVar2,local_c8,pdVar10,1,local_40._0_4_ - iVar2,1);
      pdVar10 = pdVar10 + 1;
    }
    local_78 = local_78 * dVar21;
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      local_d8[uVar3] =
           1.0 - (double)*(int *)((long)__ptr + uVar3 * 4) / (double)(SUB84(local_60,0) + 1);
    }
    local_48 = local_48 * dVar13;
    mmult(local_d8,local_98,&local_88,1,SUB84(local_60,0),1);
    dVar21 = (local_88 + local_88) / local_68 + (double)local_38;
    local_88 = dVar21;
    dVar20 = pow(local_68,-2.0);
    local_50 = (local_50 + 1.0) * 12.0 * local_58 * local_48 +
               local_58 * -12.0 * local_58 + (1.0 - dVar20) * local_78;
    dVar20 = (double)local_38 / local_88;
    dVar11 = (2.0 / dVar11 + 6.0 / local_68 + 4.0) * local_48 * local_48;
    if (dVar20 < 0.0) {
      local_40 = dVar11;
      local_60 = sqrt(dVar20);
      dVar11 = local_40;
    }
    else {
      local_60 = SQRT(dVar20);
    }
    pcVar1 = local_70;
    local_50 = local_50 - dVar11;
    if (local_88 < 0.0) {
      local_40 = sqrt(local_88);
    }
    else {
      local_40 = SQRT(local_88);
    }
    if (local_50 < 0.0) {
      local_70 = (char *)sqrt(local_50);
    }
    else {
      local_70 = (char *)SQRT(local_50);
    }
    dVar20 = dVar21 - (double)local_38;
    dVar11 = local_48 * local_48 + local_50;
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    dVar20 = dVar20 * -0.5;
    local_78 = dVar20 / dVar21;
    dVar21 = (double)local_38 / local_88;
    if (dVar21 < 0.0) {
      local_40 = local_40 * local_78;
      dVar21 = sqrt(dVar21);
      dVar13 = local_40;
    }
    else {
      dVar21 = SQRT(dVar21);
      dVar13 = local_40 * local_78;
    }
    if (local_88 < 0.0) {
      local_70 = (char *)((double)local_70 * dVar11);
      local_40 = dVar13 * local_48;
      dVar14 = sqrt(local_88);
      pcVar15 = local_70;
      dVar11 = local_40;
    }
    else {
      dVar14 = SQRT(local_88);
      pcVar15 = (char *)((double)local_70 * dVar11);
      dVar11 = dVar13 * local_48;
    }
    dVar13 = local_50 / 12.0;
    if (dVar13 < 0.0) {
      local_60 = local_60 * sig;
      local_48 = local_48 * 0.5;
      local_40 = dVar11 / (double)pcVar15;
      dVar13 = sqrt(dVar13);
      dVar17 = local_48;
      dVar19 = local_60;
      dVar11 = local_40;
    }
    else {
      dVar13 = SQRT(dVar13);
      dVar17 = local_48 * 0.5;
      dVar19 = local_60 * sig;
      dVar11 = dVar11 / (double)pcVar15;
    }
    dVar17 = dVar17 - local_58;
    if (dVar18 < 0.0) {
      local_60 = dVar19 + dVar11;
      local_58 = dVar13;
      local_48 = dVar17;
      dVar18 = sqrt(dVar18);
      dVar17 = local_48;
      dVar11 = local_60;
      dVar13 = local_58;
    }
    else {
      dVar18 = SQRT(dVar18);
      dVar11 = dVar19 + dVar11;
    }
    *auxstat = dVar11;
    auxstat[1] = dVar21 * (dVar16 / dVar12) + (dVar17 * dVar14 * local_78) / (dVar13 * dVar18);
    *laux = 2;
    iVar2 = strcmp(pcVar1,"Z-tau");
    if (iVar2 == 0) {
      local_58 = (*(double *)(obj + 1) + -1.0) / obj[1].sigma_lower;
      dVar11 = (double)local_38 / local_88;
      if (dVar11 < 0.0) {
        local_38 = (double *)sqrt(dVar11);
      }
      else {
        local_38 = (double *)SQRT(dVar11);
      }
      if (local_88 < 0.0) {
        dVar11 = sqrt(local_88);
      }
      else {
        dVar11 = SQRT(local_88);
      }
      if (local_50 < 0.0) {
        local_40 = dVar11;
        dVar16 = sqrt(local_50);
        dVar11 = local_40;
      }
      else {
        dVar16 = SQRT(local_50);
      }
      *teststat = (double)local_38 * local_58 + (local_78 * dVar11) / dVar16;
    }
    else {
      iVar2 = strcmp(pcVar1,"Z-alpha");
      if (iVar2 == 0) {
        *teststat = local_68 * (*(double *)(obj + 1) + -1.0) + dVar20 / local_50;
        cval[2] = NAN;
        cval[1] = NAN;
        *cval = NAN;
      }
    }
    free(__src);
    free(varcovar);
  }
  else {
    iVar2 = strcmp(model,"constant");
    dVar11 = local_40;
    if (iVar2 != 0) {
      return;
    }
    iVar2 = local_40._0_4_;
    dVar18 = (double)(local_40._0_4_ * local_40._0_4_);
    *cval = -29.25 / dVar18 + -5.999 / local_68 + -3.4335;
    cval[1] = -8.36 / dVar18 + -2.738 / local_68 + -2.8621;
    cval[2] = -4.48 / dVar18 + -1.438 / local_68 + -2.5671;
    *cprobs = 0.01;
    cprobs[1] = 0.05;
    cprobs[2] = 0.1;
    local_e0 = (double *)malloc(0x20);
    sVar9 = lVar7 << 3;
    local_c8 = (double *)malloc(sVar9);
    local_c0 = (double *)malloc(sVar9);
    memcpy(local_c8,local_38,sVar9);
    obj = reg_init(iVar2,2);
    regress(obj,local_c8,pdVar10,local_c0,local_e0,0.95);
    local_58 = obj->beta[0].value;
    dVar16 = obj->beta[0].stdErr;
    dVar12 = mean(pdVar10,iVar2);
    uVar3 = 0;
    uVar4 = 0;
    if (0 < iVar2) {
      uVar4 = (ulong)dVar11 & 0xffffffff;
    }
    dVar20 = 0.0;
    dVar11 = 0.0;
    dVar21 = 0.0;
    local_50 = 0.0;
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      dVar20 = dVar20 + local_c0[uVar3] * local_c0[uVar3];
      dVar13 = pdVar10[uVar3];
      dVar11 = dVar11 + (dVar13 - dVar12) * (dVar13 - dVar12);
      local_50 = local_50 + dVar13;
      dVar21 = dVar21 + dVar13 * dVar13;
    }
    local_38 = (double *)(1.0 / local_68);
    local_48 = 1.0 / dVar18;
    sig = dVar11 * local_48;
    local_78 = pow(local_68,-1.5);
    __ptr = malloc(lVar6 * 4);
    local_98 = (double *)malloc(lVar6 * 8);
    local_d8 = (double *)malloc(lVar6 * 8);
    uVar4 = 0;
    uVar3 = 0;
    if (0 < iVar8) {
      uVar4 = (ulong)local_60 & 0xffffffff;
    }
    while (uVar4 != uVar3) {
      *(int *)((long)__ptr + uVar3 * 4) = (int)(uVar3 + 1);
      uVar3 = uVar3 + 1;
    }
    local_58 = local_58 / dVar16;
    local_48 = local_48 * dVar21;
    pdVar10 = local_98;
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      iVar2 = *(int *)((long)__ptr + uVar3 * 4);
      mmult(local_c0 + iVar2,local_c0,pdVar10,1,local_40._0_4_ - iVar2,1);
      pdVar10 = pdVar10 + 1;
    }
    local_38 = (double *)((double)local_38 * dVar20);
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      local_d8[uVar3] =
           1.0 - (double)*(int *)((long)__ptr + uVar3 * 4) / (double)(SUB84(local_60,0) + 1);
    }
    mmult(local_d8,local_98,&local_88,1,SUB84(local_60,0),1);
    local_88 = (local_88 + local_88) / local_68 + (double)local_38;
    dVar11 = (double)local_38 / local_88;
    local_40 = local_88;
    if (dVar11 < 0.0) {
      local_60 = sqrt(dVar11);
    }
    else {
      local_60 = SQRT(dVar11);
    }
    pcVar1 = local_70;
    if (local_88 < 0.0) {
      local_70 = (char *)sqrt(local_88);
    }
    else {
      local_70 = (char *)SQRT(local_88);
    }
    if (local_48 < 0.0) {
      dVar11 = sqrt(local_48);
    }
    else {
      dVar11 = SQRT(local_48);
    }
    dVar16 = local_50 * local_78;
    local_48 = local_40 - (double)local_38;
    if (sig < 0.0) {
      local_78 = dVar11;
      local_50 = dVar16;
      dVar12 = sqrt(sig);
      dVar16 = local_50;
      dVar11 = local_78;
    }
    else {
      dVar12 = SQRT(sig);
    }
    local_48 = local_48 * -0.5;
    local_40 = local_48 / local_40;
    *auxstat = local_60 * local_58 + (dVar16 * (double)local_70 * local_40) / (dVar11 * dVar12);
    *laux = 1;
    iVar2 = strcmp(pcVar1,"Z-tau");
    if (iVar2 == 0) {
      local_58 = (*(double *)(obj + 1) + -1.0) / obj[1].sigma_lower;
      dVar11 = (double)local_38 / local_88;
      if (dVar11 < 0.0) {
        local_38 = (double *)sqrt(dVar11);
      }
      else {
        local_38 = (double *)SQRT(dVar11);
      }
      if (local_88 < 0.0) {
        dVar11 = sqrt(local_88);
      }
      else {
        dVar11 = SQRT(local_88);
      }
      if (sig < 0.0) {
        local_68 = dVar11;
        dVar16 = sqrt(sig);
        dVar11 = local_68;
      }
      else {
        dVar16 = SQRT(sig);
      }
      *teststat = (double)local_38 * local_58 + (local_40 * dVar11) / dVar16;
    }
    else {
      iVar2 = strcmp(pcVar1,"Z-alpha");
      if (iVar2 == 0) {
        *teststat = local_68 * (*(double *)(obj + 1) + -1.0) + local_48 / sig;
        cval[2] = NAN;
        cval[1] = NAN;
        *cval = NAN;
      }
    }
  }
  free(local_e0);
  free(local_c8);
  free(local_c0);
  free(__ptr);
  free(local_98);
  free(local_d8);
  free_reg(obj);
  return;
}

Assistant:

void ur_pp2(double *x, int N,const char* type,const char* model,int lshort, int *klag,double *cval,double *cprobs, double *auxstat,int *laux,double *teststat) {
    /* 
    ur_pp2
    C version of the R code by
    Bernhard Pfaff [aut, cre], Eric Zivot [ctb], Matthieu Stigler [ctb]. urca: Unit Root and Cointegration Tests for Time Series Data
    License Information : https://cran.r-project.org/web/packages/urca/urca.pdf
    */
    double *y,*y_li,*trend,*XX,*varcovar,*res,*tt,*coprods,*weights;
    int *idx;
    int N1, lmax, i,p, N12,len,iter;
    double N1d,at,my_tstat,beta_tstat,s,sum_res,sum_ymy,sum_y2,ymean,tstat;
    double myybar,myy,mty,my,sum_y,sig,lambda,lambda_prime,M,my_stat,beta_stat;
    reg_object fit;

    N1 = N - 1;
    y = &x[1];// length N1
    y_li = &x[0];// Length N1

    if (lshort == 1) {
        lmax = (int) 4.0 * pow(((double) N1)/100.0,0.25);
    } else {
        lmax = (int) 12.0 * pow(((double) N1)/100.0,0.25);
    }

    if (klag != NULL && *klag > 0) {
        lmax = *klag;
    }

    if (!strcmp(model,"trend")) {
        cval[0] = -3.9638-8.353/N1-47.44/(N1*N1);
        cval[1] = -3.4126-4.039/N1-17.83/(N1*N1);
        cval[2] = -3.1279-2.418/N1-7.58/(N1*N1);
        cprobs[0] = 0.01;
        cprobs[1] = 0.05;
        cprobs[2] = 0.1;

        //mdisplay(cval,1,3);
        trend = (double*)malloc(sizeof(double)*N1);
        tt = (double*)malloc(sizeof(double)*N1);
        N1d = (double) N1 / 2.0;

        for(i = 1; i <= N1;++i) {
            trend[i-1] = (double)i - N1d;
            tt[i-1] = (double) i;
        } 

        p = 3;
        varcovar = (double*)malloc(sizeof(double)*p*p);
        XX = (double*)malloc(sizeof(double)*2*N1);
        res = (double*)malloc(sizeof(double)*N1);

        memcpy(XX,y_li,sizeof(double)*N1);
        memcpy(XX+N1,trend,sizeof(double)*N1);

        at = 0.95;

        fit = reg_init(N1,p);

        regress(fit,XX,y,res,varcovar,at);

        /*summary(fit);
        anova(fit);
        mdisplay(res,1,N1);
        mdisplay(XX,2,N1);
        mdisplay(y,1,N1);
        */

        my_tstat = (fit->beta+0)->value/(fit->beta+0)->stdErr;
        beta_tstat = (fit->beta+2)->value/(fit->beta+2)->stdErr;

        //printf("c1 %g c2 %g \n",my_tstat,beta_tstat);

        sum_res = 0.0;
        sum_ymy = 0.0;
        sum_y2 = 0.0;
        sum_y = 0.0;
        mty = 0.0;

        ymean = mean(y,N1);
        N12 = N1 * N1;

        for(i = 0; i < N1;++i) {
            sum_res += (res[i] *res[i]);
            sum_ymy += (y[i] - ymean)*(y[i] - ymean);
            sum_y2 += (y[i] *y[i]);
            mty += (tt[i]*y[i]);
            sum_y += y[i];
        }

        s = 1.0 /(double)N1 * sum_res;
        myybar = 1.0 / (double) N12 *sum_ymy;
        myy = 1.0 / (double) N12 *sum_y2;
        mty = pow((double)N1, -2.5) * mty;
        my = pow((double)N1, -1.5) * sum_y;

        //printf("c1 %g c2 %g s %g sum_ymy %g sum_y2 %g mty %g my %g \n",my_tstat,beta_tstat,s,myybar,myy,mty,my);

        idx = (int*)malloc(sizeof(int)*lmax);
        coprods = (double*)malloc(sizeof(double)*lmax);
        weights = (double*)malloc(sizeof(double)*lmax);

        for(i = 0; i < lmax;++i) {
            idx[i] = i+1;
        }

        for(i = 0; i < lmax;++i) {
            iter = idx[i];
            len = N1 - iter;
            mmult(res+iter,res,coprods+i,1,len,1);
        }

        for(i = 0; i < lmax;++i) {
            weights[i] = 1.0 - (double) idx[i] / (double) (lmax+1);
        }

        //mdisplay(weights,1,lmax);

        mmult(weights,coprods,&sig,1,lmax,1);

        sig = s + 2.0 * sig / (double) N1;
        lambda = 0.5 * (sig - s);
        lambda_prime = lambda/sig;
        M = (1-pow((double)N1, -2.0))*myy - 12*mty*mty + 12.0*(1.0 + 1.0/(double)N1)*mty*my - (4 + 6/(double)N1 + 2/(double)(N1*N1))*my*my;
        my_stat = sqrt(s/sig)*my_tstat - lambda_prime*sqrt(sig)*my/(sqrt(M)*sqrt((M+my*my)));
        beta_stat = sqrt(s/sig)*beta_tstat - lambda_prime*sqrt(sig)*(0.5*my - mty)/(sqrt(M/12)*sqrt(myybar));
        auxstat[0] = my_stat;
        auxstat[1] = beta_stat;

        *laux = 2;

        if (!strcmp(type,"Z-tau")) {
            tstat = ((fit->beta+1)->value - 1.0)/(fit->beta+1)->stdErr;
            *teststat = sqrt(s/sig)*tstat-lambda_prime*sqrt(sig)/sqrt(M);
        } else if (!strcmp(type,"Z-alpha")) {
            *teststat = (double)N1 * ((fit->beta+1)->value - 1.0) - lambda/M;
            cval[0] = cval[1] = cval[2] = NAN;
        }

        //printf("sig %g lambda %g lambda_prime %g M %g my_stat %g beta_stat %g teststat %g \n",sig,lambda,lambda_prime,M,my_stat,beta_stat,*teststat);


        free(trend);
        free(varcovar);
        free(XX);
        free(res);
        free(tt);
        free(idx);
        free(coprods);
        free(weights);
        free_reg(fit);
    } else if (!strcmp(model,"constant")) {
        cval[0] = -3.4335-5.999/(double)N1-29.25/(double)(N1*N1);
        cval[1] = -2.8621-2.738/(double)N1-8.36/(double)(N1*N1);
        cval[2] = -2.5671-1.438/(double)N1-4.48/(double)(N1*N1);
        cprobs[0] = 0.01;
        cprobs[1] = 0.05;
        cprobs[2] = 0.1;

        //mdisplay(cval,1,3);

        p = 2;
        varcovar = (double*)malloc(sizeof(double)*p*p);
        XX = (double*)malloc(sizeof(double)*N1);
        res = (double*)malloc(sizeof(double)*N1);

        memcpy(XX,y_li,sizeof(double)*N1);

        at = 0.95;

        fit = reg_init(N1,p);

        regress(fit,XX,y,res,varcovar,at);

        //summary(fit);
        //anova(fit);
        //mdisplay(res,1,N1);
        //mdisplay(XX,2,N1);
        //mdisplay(y,1,N1);

        my_tstat = (fit->beta+0)->value/(fit->beta+0)->stdErr;

        sum_res = 0.0;
        sum_ymy = 0.0;
        sum_y2 = 0.0;
        sum_y = 0.0;

        ymean = mean(y,N1);
        N12 = N1 * N1;

        for(i = 0; i < N1;++i) {
            sum_res += (res[i] *res[i]);
            sum_ymy += (y[i] - ymean)*(y[i] - ymean);
            sum_y2 += (y[i] *y[i]);
            sum_y += y[i];
        }

        s = 1.0 /(double)N1 * sum_res;
        myybar = 1.0 / (double) N12 *sum_ymy;
        myy = 1.0 / (double) N12 *sum_y2;
        my = pow((double)N1, -1.5) * sum_y;

        //printf("c1 %g s %g sum_ymy %g sum_y2 %g my %g \n",my_tstat,s,myybar,myy,my);

        idx = (int*)malloc(sizeof(int)*lmax);
        coprods = (double*)malloc(sizeof(double)*lmax);
        weights = (double*)malloc(sizeof(double)*lmax);

        for(i = 0; i < lmax;++i) {
            idx[i] = i+1;
        }

        for(i = 0; i < lmax;++i) {
            iter = idx[i];
            len = N1 - iter;
            mmult(res+iter,res,coprods+i,1,len,1);
        }

        for(i = 0; i < lmax;++i) {
            weights[i] = 1.0 - (double) idx[i] / (double) (lmax+1);
        }

        //mdisplay(coprods,1,lmax);

        //mdisplay(weights,1,lmax);

        mmult(weights,coprods,&sig,1,lmax,1);

        sig = s + 2.0 * sig / (double) N1;
        lambda = 0.5 * (sig - s);
        lambda_prime = lambda/sig;

        my_stat = sqrt(s/sig)*my_tstat - lambda_prime*sqrt(sig)*my/(sqrt(myy)*sqrt(myybar));
        auxstat[0] = my_stat;
        *laux = 1;

        if (!strcmp(type,"Z-tau")) {
            tstat = ((fit->beta+1)->value - 1.0)/(fit->beta+1)->stdErr;
            *teststat = sqrt(s/sig)*tstat-lambda_prime*sqrt(sig)/sqrt(myybar);
        } else if (!strcmp(type,"Z-alpha")) {
            *teststat = (double)N1 * ((fit->beta+1)->value - 1.0) - lambda/myybar;
            cval[0] = cval[1] = cval[2] = NAN;
        }

        //printf("sig %g lambda %g lambda_prime %g my_stat %g teststat %g \n",sig,lambda,lambda_prime,my_stat,*teststat);
        



        free(varcovar);
        free(XX);
        free(res);
        free(idx);
        free(coprods);
        free(weights);
        free_reg(fit);
    }
}